

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_256_paramSetA.c
# Opt level: O1

void scalar_rwnaf(int8_t *out,uchar *in)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int8_t *piVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  
  uVar1 = (uint)(byte)((*in & 0x3e) + 1);
  uVar2 = 10;
  piVar5 = out;
  do {
    cVar6 = ((byte)uVar1 & 0x3f) - 0x20;
    *piVar5 = cVar6;
    iVar7 = 0;
    iVar3 = 0;
    if (uVar2 != 0x203) {
      iVar3 = (in[uVar2 - 3 >> 3 & 0x1fffffff] >> ((byte)(uVar2 - 3) & 7) & 1) << 0x1a;
      iVar7 = (in[uVar2 - 2 >> 3 & 0x1fffffff] >> ((byte)(uVar2 - 2) & 7) & 1) << 0x1b;
    }
    iVar4 = 0;
    iVar8 = 0;
    if (uVar2 != 0x203) {
      iVar8 = (in[uVar2 - 1 >> 3 & 0x1fffffff] >> ((byte)(uVar2 - 1) & 7) & 1) << 0x1c;
      iVar4 = (in[uVar2 >> 3 & 0x1fffffff] >> ((byte)uVar2 & 7) & 1) << 5;
    }
    uVar1 = (((int)(char)(byte)uVar1 - (int)cVar6 & 0xffffffe0U) * 0x80000 +
             (in[uVar2 - 4 >> 3 & 0x1fffffff] >> ((byte)(uVar2 - 4) & 7) & 1) * 0x2000000 + iVar3 +
             iVar7 + iVar8 >> 0x18) + iVar4;
    piVar5 = piVar5 + 1;
    uVar2 = uVar2 + 5;
  } while (uVar2 != 0x208);
  out[0x66] = (int8_t)uVar1;
  return;
}

Assistant:

static void scalar_rwnaf(int8_t out[52], const unsigned char in[32]) {
    int i;
    int8_t window, d;

    window = (in[0] & (DRADIX_WNAF - 1)) | 1;
    for (i = 0; i < 51; i++) {
        d = (window & (DRADIX_WNAF - 1)) - DRADIX;
        out[i] = d;
        window = (window - d) >> RADIX;
        window += scalar_get_bit(in, (i + 1) * RADIX + 1) << 1;
        window += scalar_get_bit(in, (i + 1) * RADIX + 2) << 2;
        window += scalar_get_bit(in, (i + 1) * RADIX + 3) << 3;
        window += scalar_get_bit(in, (i + 1) * RADIX + 4) << 4;
        window += scalar_get_bit(in, (i + 1) * RADIX + 5) << 5;
    }
    out[i] = window;
}